

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeout.c
# Opt level: O0

void see_lamp_flicker(obj *obj,char *tailer)

{
  char cVar1;
  char *pcVar2;
  char *tailer_local;
  obj *obj_local;
  
  cVar1 = obj->where;
  if (cVar1 == '\x01') {
    pcVar2 = xname(obj);
    pcVar2 = an(pcVar2);
    pline("You see %s flicker%s.",pcVar2,tailer);
  }
  else {
    if (cVar1 != '\x03' && cVar1 != '\x04') {
      return;
    }
    pcVar2 = Yname2(obj);
    pline("%s flickers%s.",pcVar2,tailer);
  }
  *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xffffffef | 0x10;
  return;
}

Assistant:

static void see_lamp_flicker(struct obj *obj, const char *tailer)
{
	switch (obj->where) {
	    case OBJ_INVENT:
	    case OBJ_MINVENT:
		pline("%s flickers%s.", Yname2(obj), tailer);
		break;
	    case OBJ_FLOOR:
		pline("You see %s flicker%s.", an(xname(obj)), tailer);
		break;
	    default:
		return;
	}
	obj->known = 1;	/* ID charge count */
}